

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

QByteArray * cleaned(QByteArray *__return_storage_ptr__,QByteArray *input)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  Data *pDVar4;
  char cVar5;
  uint uVar6;
  QByteArray *extraout_RAX;
  char *pcVar7;
  char *pcVar8;
  char *__s;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QByteArray::resize(__return_storage_ptr__,(input->d).size);
  pcVar11 = (input->d).ptr;
  if (pcVar11 == (char *)0x0) {
    pcVar11 = "";
  }
  lVar3 = (input->d).size;
  pDVar4 = (__return_storage_ptr__->d).d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
  }
  pcVar10 = (__return_storage_ptr__->d).ptr;
  __s = pcVar10;
  if (lVar3 != 0) {
    pcVar10 = pcVar11 + lVar3;
    iVar9 = 0;
LAB_001403fb:
    do {
      cVar5 = *pcVar11;
      if ((cVar5 == ' ') || (cVar5 == '\t')) {
        pcVar11 = pcVar11 + 1;
        if (pcVar11 != pcVar10) goto LAB_001403fb;
        cVar5 = *pcVar11;
      }
      if (cVar5 == '#') {
LAB_0014042b:
        *__s = '#';
        __s = __s + 1;
        do {
          pcVar11 = pcVar11 + 1;
          if (pcVar11 == pcVar10) break;
        } while ((*pcVar11 == ' ') || (*pcVar11 == '\t'));
      }
      else if ((cVar5 == '%') && (pcVar11[1] == ':')) {
        pcVar11 = pcVar11 + 1;
        goto LAB_0014042b;
      }
      if (pcVar11 != pcVar10) {
        pcVar8 = __s + 2;
        do {
          uVar6 = -iVar9;
          while (cVar5 = *pcVar11, cVar5 == '\\') {
            cVar2 = pcVar11[1];
            pcVar7 = pcVar11;
            if (cVar2 == '\r') {
              pcVar7 = pcVar11 + 1;
            }
            if (pcVar7 == pcVar10) {
              cVar5 = '\\';
              pcVar11 = pcVar7;
              if (cVar2 == '\r') {
                cVar5 = '\r';
              }
              goto LAB_001404df;
            }
            if (pcVar7[1] != '\n' && cVar2 != '\r') {
              cVar5 = '\\';
              goto LAB_001404df;
            }
            pcVar1 = pcVar7 + 1;
            pcVar11 = pcVar1;
            if (pcVar7[1] != '\r') {
              pcVar11 = pcVar7 + 2;
            }
            if (pcVar1 == pcVar10) {
              pcVar11 = pcVar1;
            }
            uVar6 = uVar6 - 1;
            if (pcVar11 == pcVar10) goto LAB_0014050c;
          }
          if (cVar5 == '\r') {
            cVar5 = (pcVar11[1] != '\n') * '\x03' + '\n';
            if (pcVar11[1] == '\n') {
              pcVar11 = pcVar11 + 1;
            }
          }
LAB_001404df:
          if (pcVar11 == pcVar10) break;
          if (cVar5 == '\r') {
            cVar5 = '\n';
          }
          *__s = cVar5;
          __s = __s + 1;
          if (*pcVar11 == '\n') {
            if (uVar6 != 0) {
              memset(__s,10,(ulong)-uVar6);
              __s = pcVar8 + ~uVar6;
            }
            pcVar11 = pcVar11 + 1;
            iVar9 = 0;
            goto LAB_00140512;
          }
          iVar9 = -uVar6;
          pcVar11 = pcVar11 + 1;
          pcVar8 = pcVar8 + 1;
        } while (pcVar11 != pcVar10);
LAB_0014050c:
        iVar9 = -uVar6;
      }
LAB_00140512:
    } while (pcVar11 != pcVar10);
    pcVar10 = (__return_storage_ptr__->d).ptr;
  }
  if (pcVar10 == (char *)0x0) {
    pcVar10 = "";
  }
  QByteArray::resize(__return_storage_ptr__,(long)__s - (long)pcVar10);
  return extraout_RAX;
}

Assistant:

static QByteArray cleaned(const QByteArray &input)
{
    QByteArray result;
    result.resize(input.size());
    const char *data = input.constData();
    const char *end = input.constData() + input.size();
    char *output = result.data();

    int newlines = 0;
    while (data != end) {
        while (data != end && is_space(*data))
            ++data;
        bool takeLine = (*data == '#');
        if (*data == '%' && *(data+1) == ':') {
            takeLine = true;
            ++data;
        }
        if (takeLine) {
            *output = '#';
            ++output;
            do ++data; while (data != end && is_space(*data));
        }
        while (data != end) {
            // handle \\\n, \\\r\n and \\\r
            if (*data == '\\') {
                if (*(data + 1) == '\r') {
                    ++data;
                }
                if (data != end && (*(data + 1) == '\n' || (*data) == '\r')) {
                    ++newlines;
                    data += 1;
                    if (data != end && *data != '\r')
                        data += 1;
                    continue;
                }
            } else if (*data == '\r' && *(data + 1) == '\n') { // reduce \r\n to \n
                ++data;
            }
            if (data == end)
                break;

            char ch = *data;
            if (ch == '\r') // os9: replace \r with \n
                ch = '\n';
            *output = ch;
            ++output;

            if (*data == '\n') {
                // output additional newlines to keep the correct line-numbering
                // for the lines following the backslash-newline sequence(s)
                while (newlines) {
                    *output = '\n';
                    ++output;
                    --newlines;
                }
                ++data;
                break;
            }
            ++data;
        }
    }
    result.resize(output - result.constData());
    return result;
}